

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkv_interface.cpp
# Opt level: O0

void __thiscall MkvInterface::handleInfo(MkvInterface *this)

{
  EbmlStream *pEVar1;
  EbmlUInteger *pEVar2;
  EbmlFloat *pEVar3;
  EbmlUnicodeString *pEVar4;
  FILE *pFVar5;
  bool bVar6;
  int iVar7;
  uint32 uVar8;
  undefined4 extraout_var;
  EbmlElement *pEVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  IOCallback *pIVar10;
  UTFstring *pUVar11;
  undefined8 uVar12;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  ulong uVar13;
  double dVar14;
  UTFstring local_178;
  EbmlUnicodeString *local_140;
  KaxWritingApp *pApp_1;
  size_t local_130;
  UTFstring local_128;
  EbmlUnicodeString *local_f0;
  KaxMuxingApp *pApp;
  size_t local_e0;
  UTFstring local_c8;
  EbmlUnicodeString *local_90;
  KaxSegmentFilename *fn;
  size_t local_80;
  EbmlId local_78;
  EbmlFloat *local_68;
  KaxDuration *Duration;
  size_t local_58;
  EbmlUInteger *local_50;
  KaxTimecodeScale *TimeScale;
  size_t local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  ulong local_20;
  uint local_14;
  MkvInterface *pMStack_10;
  uint i;
  MkvInterface *this_local;
  
  pEVar1 = this->aStream;
  pMStack_10 = this;
  iVar7 = (*this->m_element1->_vptr_EbmlElement[4])();
  pEVar9 = libebml::EbmlStream::FindNextElement
                     (pEVar1,*(EbmlSemanticContext **)(CONCAT44(extraout_var,iVar7) + 0x18),
                      &this->m_upperElementa,0xffffffff,(bool)(this->m_allowDummy & 1),1);
  this->m_element2a = pEVar9;
  do {
    while( true ) {
      if ((this->m_element2a == (EbmlElement *)0x0) || (0 < this->m_upperElementa))
      goto LAB_001b271e;
      if (this->m_upperElementa < 0) {
        this->m_upperElementa = 0;
      }
      if ((this->m_verbose & 1U) != 0) {
        fprintf(_stderr,"\tEBML ID: ");
        local_14 = 0;
        while( true ) {
          uVar13 = (ulong)local_14;
          iVar7 = (*this->m_element2a->_vptr_EbmlElement[3])();
          pFVar5 = _stderr;
          local_28 = *(undefined8 *)CONCAT44(extraout_var_00,iVar7);
          local_20 = ((undefined8 *)CONCAT44(extraout_var_00,iVar7))[1];
          if (local_20 <= uVar13) break;
          iVar7 = (*this->m_element2a->_vptr_EbmlElement[3])();
          local_38 = *(undefined8 *)CONCAT44(extraout_var_01,iVar7);
          local_30 = ((undefined8 *)CONCAT44(extraout_var_01,iVar7))[1];
          fprintf(pFVar5,"[%02X]",
                  (ulong)((uint)local_38 >> (('\x01' - (char)local_14) * '\b' & 0x1fU) & 0xff));
          local_14 = local_14 + 1;
        }
        fprintf(_stderr,"\n");
      }
      iVar7 = (*this->m_element2a->_vptr_EbmlElement[3])();
      TimeScale = *(KaxTimecodeScale **)CONCAT44(extraout_var_02,iVar7);
      local_40 = ((undefined8 *)CONCAT44(extraout_var_02,iVar7))[1];
      bVar6 = libebml::EbmlId::operator==
                        ((EbmlId *)&TimeScale,
                         (EbmlId *)libmatroska::KaxTimecodeScale::ClassInfos._8_8_);
      if (bVar6) {
        pEVar2 = (EbmlUInteger *)this->m_element2a;
        local_50 = pEVar2;
        pIVar10 = libebml::EbmlStream::I_O(this->aStream);
        (*(pEVar2->super_EbmlElement)._vptr_EbmlElement[10])(pEVar2,pIVar10,1);
        pFVar5 = _stderr;
        uVar8 = libebml::EbmlUInteger::operator_cast_to_unsigned_int(local_50);
        fprintf(pFVar5,"\tTimecode Scale : %d\n",(ulong)uVar8);
      }
      else {
        iVar7 = (*this->m_element2a->_vptr_EbmlElement[3])();
        Duration = *(KaxDuration **)CONCAT44(extraout_var_03,iVar7);
        local_58 = ((undefined8 *)CONCAT44(extraout_var_03,iVar7))[1];
        bVar6 = libebml::EbmlId::operator==
                          ((EbmlId *)&Duration,(EbmlId *)libmatroska::KaxDuration::ClassInfos._8_8_)
        ;
        if (bVar6) {
          pEVar3 = (EbmlFloat *)this->m_element2a;
          local_68 = pEVar3;
          pIVar10 = libebml::EbmlStream::I_O(this->aStream);
          (*(pEVar3->super_EbmlElement)._vptr_EbmlElement[10])(pEVar3,pIVar10,1);
          dVar14 = libebml::EbmlFloat::GetValue(local_68);
          this->m_duration = (float)dVar14;
          fprintf(_stderr,"\tSegment duration : %0.2fs\n",
                  (double)((this->m_duration * 1000.0) / 1e+06));
        }
        else {
          iVar7 = (*this->m_element2a->_vptr_EbmlElement[3])();
          local_78._0_8_ = *(undefined8 *)CONCAT44(extraout_var_04,iVar7);
          local_78.Length = ((undefined8 *)CONCAT44(extraout_var_04,iVar7))[1];
          bVar6 = libebml::EbmlId::operator==
                            (&local_78,(EbmlId *)libmatroska::KaxDateUTC::ClassInfos._8_8_);
          if (bVar6) {
            fprintf(_stderr,"\tDate UTC\n");
          }
          else {
            iVar7 = (*this->m_element2a->_vptr_EbmlElement[3])();
            fn = *(KaxSegmentFilename **)CONCAT44(extraout_var_05,iVar7);
            local_80 = ((undefined8 *)CONCAT44(extraout_var_05,iVar7))[1];
            bVar6 = libebml::EbmlId::operator==
                              ((EbmlId *)&fn,
                               (EbmlId *)libmatroska::KaxSegmentFilename::ClassInfos._8_8_);
            if (bVar6) {
              pEVar4 = (EbmlUnicodeString *)this->m_element2a;
              local_90 = pEVar4;
              pIVar10 = libebml::EbmlStream::I_O(this->aStream);
              (*(pEVar4->super_EbmlElement)._vptr_EbmlElement[10])(pEVar4,pIVar10,1);
              pFVar5 = _stderr;
              pUVar11 = libebml::EbmlUnicodeString::operator_cast_to_UTFstring_(local_90);
              libebml::UTFstring::UTFstring(&local_c8,pUVar11);
              libebml::UTFstring::GetUTF8_abi_cxx11_(&local_c8);
              uVar12 = std::__cxx11::string::c_str();
              fprintf(pFVar5,"\tSegment filename : %s\n",uVar12);
              libebml::UTFstring::~UTFstring(&local_c8);
            }
            else {
              iVar7 = (*this->m_element2a->_vptr_EbmlElement[3])();
              pApp = *(KaxMuxingApp **)CONCAT44(extraout_var_06,iVar7);
              local_e0 = ((undefined8 *)CONCAT44(extraout_var_06,iVar7))[1];
              bVar6 = libebml::EbmlId::operator==
                                ((EbmlId *)&pApp,
                                 (EbmlId *)libmatroska::KaxMuxingApp::ClassInfos._8_8_);
              if (bVar6) {
                pEVar4 = (EbmlUnicodeString *)this->m_element2a;
                local_f0 = pEVar4;
                pIVar10 = libebml::EbmlStream::I_O(this->aStream);
                (*(pEVar4->super_EbmlElement)._vptr_EbmlElement[10])(pEVar4,pIVar10,1);
                pFVar5 = _stderr;
                pUVar11 = libebml::EbmlUnicodeString::operator_cast_to_UTFstring_(local_f0);
                libebml::UTFstring::UTFstring(&local_128,pUVar11);
                libebml::UTFstring::GetUTF8_abi_cxx11_(&local_128);
                uVar12 = std::__cxx11::string::c_str();
                fprintf(pFVar5,"\tMuxing app : %s\n",uVar12);
                libebml::UTFstring::~UTFstring(&local_128);
              }
              else {
                iVar7 = (*this->m_element2a->_vptr_EbmlElement[3])();
                pApp_1 = *(KaxWritingApp **)CONCAT44(extraout_var_07,iVar7);
                local_130 = ((undefined8 *)CONCAT44(extraout_var_07,iVar7))[1];
                bVar6 = libebml::EbmlId::operator==
                                  ((EbmlId *)&pApp_1,
                                   (EbmlId *)libmatroska::KaxWritingApp::ClassInfos._8_8_);
                if (bVar6) {
                  pEVar4 = (EbmlUnicodeString *)this->m_element2a;
                  local_140 = pEVar4;
                  pIVar10 = libebml::EbmlStream::I_O(this->aStream);
                  (*(pEVar4->super_EbmlElement)._vptr_EbmlElement[10])(pEVar4,pIVar10,1);
                  pFVar5 = _stderr;
                  pUVar11 = libebml::EbmlUnicodeString::operator_cast_to_UTFstring_(local_140);
                  libebml::UTFstring::UTFstring(&local_178,pUVar11);
                  libebml::UTFstring::GetUTF8_abi_cxx11_(&local_178);
                  uVar12 = std::__cxx11::string::c_str();
                  fprintf(pFVar5,"\tWriting app : %s\n",uVar12);
                  libebml::UTFstring::~UTFstring(&local_178);
                }
                else {
                  fprintf(_stderr,"\tOther...\n");
                }
              }
            }
          }
        }
      }
      if (0 < this->m_upperElementa) break;
      pEVar9 = this->m_element2a;
      pEVar1 = this->aStream;
      iVar7 = (*this->m_element2a->_vptr_EbmlElement[4])();
      libebml::EbmlElement::SkipData
                (pEVar9,pEVar1,*(EbmlSemanticContext **)(CONCAT44(extraout_var_08,iVar7) + 0x18),
                 (EbmlElement *)0x0,false);
      if (this->m_element2a != (EbmlElement *)0x0) {
        (*this->m_element2a->_vptr_EbmlElement[1])();
      }
      pEVar1 = this->aStream;
      iVar7 = (*this->m_element1->_vptr_EbmlElement[4])();
      pEVar9 = libebml::EbmlStream::FindNextElement
                         (pEVar1,*(EbmlSemanticContext **)(CONCAT44(extraout_var_09,iVar7) + 0x18),
                          &this->m_upperElementa,0xffffffff,(bool)(this->m_allowDummy & 1),1);
      this->m_element2a = pEVar9;
    }
    this->m_upperElementa = this->m_upperElementa + -1;
    if (this->m_element2a != (EbmlElement *)0x0) {
      (*this->m_element2a->_vptr_EbmlElement[1])();
    }
    this->m_element2a = this->m_element3a;
  } while (this->m_upperElementa < 1);
LAB_001b271e:
  fprintf(_stderr,"\n");
  return;
}

Assistant:

void MkvInterface::handleInfo()
{
    m_element2a = aStream->FindNextElement(m_element1->Generic().Context, m_upperElementa, 0xFFFFFFFFL, m_allowDummy);
    
    while (m_element2a != NULL) 
    {
        if (m_upperElementa > 0)
            break;
        if (m_upperElementa < 0)
            m_upperElementa = 0;
    
        //fprintf(stderr, "\tFILE POS = %d, ELEMENT POS = %d\n", m_file->getFilePointer(), m_element2a->GetElementPosition());
        
        if (m_verbose)
        {
            fprintf(stderr, "\tEBML ID: ");
            for (unsigned int i=0; i<EbmlId(*m_element2a).Length; i++)
                fprintf(stderr, "[%02X]", (EbmlId(*m_element2a).Value >> (8*(1-i))) & 0xFF);
            fprintf(stderr, "\n");
        }
        
        if (EbmlId(*m_element2a) == KaxTimecodeScale::ClassInfos.GlobalId)
        {
            KaxTimecodeScale *TimeScale = static_cast<KaxTimecodeScale*>(m_element2a);
            TimeScale->ReadData(aStream->I_O());
            fprintf(stderr, "\tTimecode Scale : %d\n", uint32(*TimeScale));
        }
        else if (EbmlId(*m_element2a) == KaxDuration::ClassInfos.GlobalId)
        {
            KaxDuration *Duration = static_cast<KaxDuration*>(m_element2a);
            Duration->ReadData(aStream->I_O());
            m_duration = Duration->GetValue();
            fprintf(stderr, "\tSegment duration : %0.2fs\n", 1000*m_duration/TIMECODE_SCALE);
        }
        else if (EbmlId(*m_element2a) == KaxDateUTC::ClassInfos.GlobalId)
        {
            fprintf(stderr, "\tDate UTC\n");
        }
        else if (EbmlId(*m_element2a) == KaxSegmentFilename::ClassInfos.GlobalId)
        {
            KaxSegmentFilename *fn = static_cast<KaxSegmentFilename*>(m_element2a);
            fn->ReadData(aStream->I_O());
            fprintf(stderr, "\tSegment filename : %s\n", UTFstring(*fn).GetUTF8().c_str());
        }
        else if (EbmlId(*m_element2a) == KaxMuxingApp::ClassInfos.GlobalId)
        {
            KaxMuxingApp *pApp = static_cast<KaxMuxingApp*>(m_element2a);
            pApp->ReadData(aStream->I_O());
            fprintf(stderr, "\tMuxing app : %s\n", UTFstring(*pApp).GetUTF8().c_str());
        }
        else if (EbmlId(*m_element2a) == KaxWritingApp::ClassInfos.GlobalId)
        {
            KaxWritingApp *pApp = static_cast<KaxWritingApp*>(m_element2a);
            pApp->ReadData(aStream->I_O());
            fprintf(stderr, "\tWriting app : %s\n", UTFstring(*pApp).GetUTF8().c_str());
        }
        else
        {
            fprintf(stderr, "\tOther...\n");
        }
        
        if (m_upperElementa > 0)
        {
            m_upperElementa--;
            delete m_element2a;
            m_element2a = m_element3a;
            if (m_upperElementa > 0)
                break;
        } 
        else
        {
            m_element2a->SkipData(*aStream, m_element2a->Generic().Context);
            delete m_element2a;

            m_element2a = aStream->FindNextElement(m_element1->Generic().Context, m_upperElementa, 0xFFFFFFFFL, m_allowDummy);
        }
    }
    fprintf(stderr, "\n");
}